

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

bool __thiscall wabt::WastParser::ParseAlignOpt(WastParser *this,uint32_t *out_align)

{
  Location loc;
  bool bVar1;
  Result result;
  string *str;
  const_iterator s;
  const_iterator end;
  size_type sVar2;
  const_pointer pcVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined1 local_80 [8];
  string_view sv;
  Token token;
  uint32_t *out_align_local;
  WastParser *this_local;
  
  bVar1 = PeekMatch(this,AlignEqNat);
  if (bVar1) {
    Consume((Token *)&sv.size_,this);
    str = Token::text_abi_cxx11_((Token *)&sv.size_);
    string_view::string_view((string_view *)local_80,str);
    s = string_view::begin((string_view *)local_80);
    end = string_view::end((string_view *)local_80);
    result = ParseInt32(s,end,out_align,UnsignedOnly);
    bVar1 = Failed(result);
    uStack_b0 = SUB84(token.loc.filename.data_,0);
    uStack_ac = (undefined4)((ulong)token.loc.filename.data_ >> 0x20);
    local_a8 = (undefined4)token.loc.filename.size_;
    uStack_a4 = (undefined4)(token.loc.filename.size_ >> 0x20);
    uStack_a0 = token.loc.field_1._0_4_;
    uStack_9c = token.loc.field_1._4_4_;
    if (bVar1) {
      sVar2 = string_view::length((string_view *)local_80);
      pcVar3 = string_view::data((string_view *)local_80);
      loc.filename.size_._0_4_ = uStack_b0;
      loc.filename.data_ = (char *)sv.size_;
      loc.filename.size_._4_4_ = uStack_ac;
      loc.field_1.field_0.line = local_a8;
      loc.field_1.field_0.first_column = uStack_a4;
      loc.field_1.field_0.last_column = uStack_a0;
      loc.field_1._12_4_ = uStack_9c;
      Error(this,loc,"invalid alignment \"%.*s\"",sVar2 & 0xffffffff,pcVar3,in_R8,in_R9);
    }
    bVar1 = anon_unknown_1::IsPowerOfTwo(*out_align);
    if (!bVar1) {
      Error(this,0x19b3d13);
    }
    this_local._7_1_ = true;
    Token::~Token((Token *)&sv.size_);
  }
  else {
    *out_align = 0xffffffff;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WastParser::ParseAlignOpt(uint32_t* out_align) {
  WABT_TRACE(ParseAlignOpt);
  if (PeekMatch(TokenType::AlignEqNat)) {
    Token token = Consume();
    string_view sv = token.text();
    if (Failed(ParseInt32(sv.begin(), sv.end(), out_align,
                          ParseIntType::UnsignedOnly))) {
      Error(token.loc, "invalid alignment \"" PRIstringview "\"",
            WABT_PRINTF_STRING_VIEW_ARG(sv));
    }

    if (!IsPowerOfTwo(*out_align)) {
      Error(token.loc, "alignment must be power-of-two");
    }

    return true;
  } else {
    *out_align = WABT_USE_NATURAL_ALIGNMENT;
    return false;
  }
}